

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O2

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x1,coord_type y1,coord_type x2,coord_type y2,uint f1,uint f2)

{
  int y1_00;
  coord_type x2_00;
  int y2_00;
  coord_type x1_00;
  double dVar1;
  
  x2_00 = x2;
  y1_00 = y1;
  x1_00 = x1;
  y2_00 = y2;
  if ((f2 & 10) != 0 || (f1 & 10) != 0) {
    if ((f1 & 10) == (f2 & 10)) {
      return;
    }
    if ((f1 & 8) != 0) {
      y1_00 = (this->m_clip_box).y1;
      dVar1 = ((double)(x2 - x1) * (double)(y1_00 - y1)) / (double)(y2 - y1);
      x1_00 = (int)(dVar1 + *(double *)(&DAT_00118990 + (ulong)(dVar1 < 0.0) * 8)) + x1;
    }
    if ((f1 & 2) != 0) {
      y1_00 = (this->m_clip_box).y2;
      dVar1 = ((double)(x2 - x1) * (double)(y1_00 - y1)) / (double)(y2 - y1);
      x1_00 = (int)(dVar1 + *(double *)(&DAT_00118990 + (ulong)(dVar1 < 0.0) * 8)) + x1;
    }
    if ((f2 & 8) != 0) {
      y2_00 = (this->m_clip_box).y1;
      dVar1 = ((double)(x2 - x1) * (double)(y2_00 - y1)) / (double)(y2 - y1);
      x2_00 = (int)(dVar1 + *(double *)(&DAT_00118990 + (ulong)(dVar1 < 0.0) * 8)) + x1;
    }
    if ((f2 & 2) != 0) {
      y2_00 = (this->m_clip_box).y2;
      dVar1 = ((double)(x2 - x1) * (double)(y2_00 - y1)) / (double)(y2 - y1);
      x2_00 = (int)(dVar1 + *(double *)(&DAT_00118990 + (ulong)(dVar1 < 0.0) * 8)) + x1;
    }
  }
  rasterizer_cells_aa<agg::cell_aa>::line(ras,x1_00,y1_00,x2_00,y2_00);
  return;
}

Assistant:

AGG_INLINE void line_clip_y(Rasterizer& ras,
                                    coord_type x1, coord_type y1, 
                                    coord_type x2, coord_type y2, 
                                    unsigned   f1, unsigned   f2) const
        {
            f1 &= 10;
            f2 &= 10;
            if((f1 | f2) == 0)
            {
                // Fully visible
                ras.line(Conv::xi(x1), Conv::yi(y1), Conv::xi(x2), Conv::yi(y2)); 
            }
            else
            {
                if(f1 == f2)
                {
                    // Invisible by Y
                    return;
                }

                coord_type tx1 = x1;
                coord_type ty1 = y1;
                coord_type tx2 = x2;
                coord_type ty2 = y2;

                if(f1 & 8) // y1 < clip.y1
                {
                    tx1 = x1 + Conv::mul_div(m_clip_box.y1-y1, x2-x1, y2-y1);
                    ty1 = m_clip_box.y1;
                }

                if(f1 & 2) // y1 > clip.y2
                {
                    tx1 = x1 + Conv::mul_div(m_clip_box.y2-y1, x2-x1, y2-y1);
                    ty1 = m_clip_box.y2;
                }

                if(f2 & 8) // y2 < clip.y1
                {
                    tx2 = x1 + Conv::mul_div(m_clip_box.y1-y1, x2-x1, y2-y1);
                    ty2 = m_clip_box.y1;
                }

                if(f2 & 2) // y2 > clip.y2
                {
                    tx2 = x1 + Conv::mul_div(m_clip_box.y2-y1, x2-x1, y2-y1);
                    ty2 = m_clip_box.y2;
                }
                ras.line(Conv::xi(tx1), Conv::yi(ty1), 
                         Conv::xi(tx2), Conv::yi(ty2)); 
            }
        }